

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O0

void __thiscall
TidyConfigParser::setCheckConfig
          (TidyConfigParser *this,string *configName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configValues)

{
  TidyConfig *in_RDX;
  string *in_RDI;
  anon_class_24_3_d94fd32e in_stack_00000050;
  invalid_argument *exception;
  
  TidyConfig::
  visitConfig<TidyConfigParser::setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__0>
            (in_RDX,in_RDI,in_stack_00000050);
  return;
}

Assistant:

void TidyConfigParser::setCheckConfig(const std::string& configName,
                                      std::vector<std::string> configValues) {
    SLANG_TRY {
        config.visitConfig(configName, [&](auto& v) {
            if constexpr (is_vector_v<std::remove_cvref_t<decltype(v)>>) {
                parseConfigValue(v, std::move(configValues));
            }
            else {
                if (configValues.size() != 1) {
                    reportErrorAndExit(
                        fmt::format("Expected one configuration value for '{}' but got {}",
                                    configName, configValues.size()));
                }
                parseConfigValue(v, std::move(configValues.front()));
            }
        });
    }